

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_decode_transport_parameter_list
              (quicly_transport_parameters_t *params,quicly_cid_t *original_dcid,
              quicly_cid_t *initial_scid,quicly_cid_t *retry_scid,void *stateless_reset_token,
              uint8_t *src,uint8_t *end,int recognize_delayed_ack)

{
  undefined8 uVar1;
  quicly_cid_t *pqVar2;
  quicly_cid_t *pqVar3;
  quicly_cid_t *pqVar4;
  uint8_t *puVar5;
  uint64_t uVar6;
  uint64_t __n;
  sbyte sVar7;
  int iVar8;
  long lVar9;
  quicly_transport_parameters_t *pqVar10;
  quicly_transport_parameters_t *pqVar11;
  uint8_t uVar12;
  size_t cidl;
  uint uVar13;
  ulong uVar14;
  uint8_t *_src;
  uint8_t *local_68;
  quicly_transport_parameters_t *local_60;
  quicly_cid_t *local_58;
  quicly_cid_t *local_50;
  quicly_cid_t *local_48;
  undefined8 *local_40;
  uint8_t *local_38;
  
  pqVar10 = &default_transport_params;
  pqVar11 = params;
  for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pqVar11->max_stream_data).bidi_local = (pqVar10->max_stream_data).bidi_local;
    pqVar10 = (quicly_transport_parameters_t *)&(pqVar10->max_stream_data).bidi_remote;
    pqVar11 = (quicly_transport_parameters_t *)&(pqVar11->max_stream_data).bidi_remote;
  }
  if (original_dcid != &_tp_cid_ignore && original_dcid != (quicly_cid_t *)0x0) {
    original_dcid->len = 0xff;
  }
  if (initial_scid != &_tp_cid_ignore && initial_scid != (quicly_cid_t *)0x0) {
    initial_scid->len = 0xff;
  }
  if (retry_scid != &_tp_cid_ignore && retry_scid != (quicly_cid_t *)0x0) {
    retry_scid->len = 0xff;
  }
  uVar14 = 0;
  local_68 = src;
  local_60 = params;
  local_58 = retry_scid;
  local_50 = initial_scid;
  local_48 = original_dcid;
  local_40 = (undefined8 *)stateless_reset_token;
  do {
    if (src == end) {
      if ((local_60->min_ack_delay_usec == 0xffffffffffffffff) ||
         (iVar8 = 0x2000a, local_60->min_ack_delay_usec <= (ulong)local_60->max_ack_delay * 1000)) {
        if ((((local_48 == (quicly_cid_t *)0x0) || (local_48->len != 0xff)) &&
            ((local_50 == (quicly_cid_t *)0x0 || (local_50->len != 0xff)))) &&
           ((local_58 == (quicly_cid_t *)0x0 || (local_58->len != 0xff)))) {
          iVar8 = 0;
        }
        else {
          iVar8 = 0x20008;
        }
      }
      return iVar8;
    }
    uVar6 = ptls_decode_quicint(&local_68,end);
    if (uVar6 == 0xffffffffffffffff) {
      return 0x20008;
    }
    local_38 = local_68;
    __n = ptls_decode_quicint(&local_38,end);
    pqVar4 = local_48;
    pqVar3 = local_50;
    pqVar2 = local_58;
    if (__n == 0xffffffffffffffff) {
      return 0x20008;
    }
    local_68 = local_38;
    if ((ulong)((long)end - (long)local_38) < __n) {
      return 0x20008;
    }
    src = local_38 + __n;
    uVar13 = (uint)uVar14;
    uVar12 = (uint8_t)__n;
    switch(uVar6) {
    case 0:
      if ((uVar14 & 1) != 0) {
        return 0x20008;
      }
      if (local_48 == (quicly_cid_t *)0x0) {
        return 0x20008;
      }
      if (0x14 < __n) {
        return 0x20008;
      }
      if (local_48 != &_tp_cid_ignore) {
        memcpy(local_48,local_38,__n);
        pqVar4->len = uVar12;
      }
      uVar14 = uVar14 | 1;
      puVar5 = src;
      break;
    case 1:
      if ((uVar13 >> 9 & 1) != 0) {
        return 0x20008;
      }
      uVar6 = ptls_decode_quicint(&local_68,src);
      local_60->max_idle_timeout = uVar6;
      if (uVar6 == 0xffffffffffffffff) {
        return 0x20008;
      }
      uVar14 = uVar14 | 0x200;
      puVar5 = local_68;
      break;
    case 2:
      if ((uVar13 >> 8 & 1) != 0) {
        return 0x20008;
      }
      if (local_40 == (undefined8 *)0x0) {
        return 0x20008;
      }
      if (__n != 0x10) {
        return 0x20008;
      }
      uVar14 = uVar14 | 0x100;
      uVar1 = *(undefined8 *)(local_38 + 8);
      *local_40 = *(undefined8 *)local_38;
      local_40[1] = uVar1;
      puVar5 = src;
      break;
    case 3:
      if ((uVar14 & 8) != 0) {
        return 0x20008;
      }
      uVar6 = ptls_decode_quicint(&local_68,src);
      if (uVar6 + 1 < 0x4b1) {
        return 0x20008;
      }
      uVar14 = uVar14 | 8;
      if (0xfffe < uVar6) {
        uVar6 = 0xffff;
      }
      local_60->max_udp_payload_size = uVar6;
      puVar5 = local_68;
      break;
    case 4:
      if ((char)uVar14 < '\0') {
        return 0x20008;
      }
      uVar6 = ptls_decode_quicint(&local_68,src);
      local_60->max_data = uVar6;
      if (uVar6 == 0xffffffffffffffff) {
        return 0x20008;
      }
      uVar14 = uVar14 | 0x80;
      puVar5 = local_68;
      break;
    case 5:
      if ((uVar14 & 0x10) != 0) {
        return 0x20008;
      }
      uVar6 = ptls_decode_quicint(&local_68,src);
      (local_60->max_stream_data).bidi_local = uVar6;
      if (uVar6 == 0xffffffffffffffff) {
        return 0x20008;
      }
      uVar14 = uVar14 | 0x10;
      puVar5 = local_68;
      break;
    case 6:
      if ((uVar14 & 0x20) != 0) {
        return 0x20008;
      }
      uVar6 = ptls_decode_quicint(&local_68,src);
      (local_60->max_stream_data).bidi_remote = uVar6;
      if (uVar6 == 0xffffffffffffffff) {
        return 0x20008;
      }
      uVar14 = uVar14 | 0x20;
      puVar5 = local_68;
      break;
    case 7:
      if ((uVar14 & 0x40) != 0) {
        return 0x20008;
      }
      uVar6 = ptls_decode_quicint(&local_68,src);
      (local_60->max_stream_data).uni = uVar6;
      if (uVar6 == 0xffffffffffffffff) {
        return 0x20008;
      }
      uVar14 = uVar14 | 0x40;
      puVar5 = local_68;
      break;
    case 8:
      if ((uVar13 >> 10 & 1) != 0) {
        return 0x20008;
      }
      uVar6 = ptls_decode_quicint(&local_68,src);
      local_60->max_streams_bidi = uVar6;
      if (uVar6 == 0xffffffffffffffff) {
        return 0x20008;
      }
      uVar14 = uVar14 | 0x400;
      puVar5 = local_68;
      break;
    case 9:
      if ((uVar13 >> 0xb & 1) != 0) {
        return 0x20008;
      }
      uVar6 = ptls_decode_quicint(&local_68,src);
      local_60->max_streams_uni = uVar6;
      if (uVar6 == 0xffffffffffffffff) {
        return 0x20008;
      }
      uVar14 = uVar14 | 0x800;
      puVar5 = local_68;
      break;
    case 10:
      if ((uVar13 >> 0xc & 1) != 0) {
        return 0x20008;
      }
      uVar6 = ptls_decode_quicint(&local_68,src);
      if (0x14 < uVar6) {
        return 0x20008;
      }
      uVar14 = uVar14 | 0x1000;
      local_60->ack_delay_exponent = (uint8_t)uVar6;
      puVar5 = local_68;
      break;
    case 0xb:
      if ((uVar13 >> 0xd & 1) != 0) {
        return 0x20008;
      }
      uVar6 = ptls_decode_quicint(&local_68,src);
      if (0x3fff < uVar6) {
        return 0x20008;
      }
      uVar14 = uVar14 | 0x2000;
      local_60->max_ack_delay = (uint16_t)uVar6;
      puVar5 = local_68;
      break;
    default:
      if (recognize_delayed_ack == 0) {
        iVar8 = 0xe;
      }
      else {
        iVar8 = 0xf;
        if (uVar6 == 0xff02de1a) {
          if ((uVar13 >> 0xe & 1) != 0) {
            return 0x20008;
          }
          uVar6 = ptls_decode_quicint(&local_68,src);
          local_60->min_ack_delay_usec = uVar6;
          if (0xffffff < uVar6) {
            return 0x20008;
          }
          uVar14 = uVar14 | 0x4000;
          puVar5 = local_68;
          break;
        }
      }
      sVar7 = (sbyte)iVar8;
      if (uVar6 == 0xc) {
        if ((uVar13 >> sVar7 + 1 & 1) != 0) {
          return 0x20008;
        }
        uVar14 = uVar14 | 1L << sVar7 + 1;
        local_60->field_0x50 = local_60->field_0x50 | 1;
        puVar5 = local_68;
      }
      else if (uVar6 == 0x20) {
        if ((uVar13 >> sVar7 + 2 & 1) != 0) {
          return 0x20008;
        }
        uVar6 = ptls_decode_quicint(&local_68,src);
        if (uVar6 == 0xffffffffffffffff) {
          return 0x20008;
        }
        uVar14 = uVar14 | 1L << sVar7 + 2;
        if (0xfffe < uVar6) {
          uVar6 = 0xffff;
        }
        local_60->max_datagram_frame_size = (uint16_t)uVar6;
        puVar5 = local_68;
      }
      else {
        puVar5 = src;
        if (uVar6 == 0xe) {
          if ((uVar13 >> iVar8 & 1) != 0) {
            return 0x20008;
          }
          uVar6 = ptls_decode_quicint(&local_68,src);
          if (uVar6 + 1 < 3) {
            return 0x20008;
          }
          uVar14 = uVar14 | 1L << sVar7;
          local_60->active_connection_id_limit = uVar6;
          puVar5 = local_68;
        }
      }
      break;
    case 0xf:
      if ((uVar14 & 2) != 0) {
        return 0x20008;
      }
      if (local_50 == (quicly_cid_t *)0x0) {
        return 0x20008;
      }
      if (0x14 < __n) {
        return 0x20008;
      }
      if (local_50 != &_tp_cid_ignore) {
        memcpy(local_50,local_38,__n);
        pqVar3->len = uVar12;
      }
      uVar14 = uVar14 | 2;
      puVar5 = src;
      break;
    case 0x10:
      if ((uVar14 & 4) != 0) {
        return 0x20008;
      }
      if (local_58 == (quicly_cid_t *)0x0) {
        return 0x20008;
      }
      if (0x14 < __n) {
        return 0x20008;
      }
      if (local_58 != &_tp_cid_ignore) {
        memcpy(local_58,local_38,__n);
        pqVar2->len = uVar12;
      }
      uVar14 = uVar14 | 4;
      puVar5 = src;
    }
    local_68 = puVar5;
    if (local_68 != src) {
      return 0x20008;
    }
  } while( true );
}

Assistant:

int quicly_decode_transport_parameter_list(quicly_transport_parameters_t *params, quicly_cid_t *original_dcid,
                                           quicly_cid_t *initial_scid, quicly_cid_t *retry_scid, void *stateless_reset_token,
                                           const uint8_t *src, const uint8_t *end, int recognize_delayed_ack)
{
/* When non-negative, tp_index contains the literal position within the list of transport parameters recognized by this function.
 * That index is being used to find duplicates using a 64-bit bitmap (found_bits). When the transport parameter is being processed,
 * tp_index is set to -1. */
#define DECODE_TP(_id, block)                                                                                                      \
    do {                                                                                                                           \
        if (tp_index >= 0) {                                                                                                       \
            if (id == (_id)) {                                                                                                     \
                if ((found_bits & ((uint64_t)1 << tp_index)) != 0) {                                                               \
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                              \
                    goto Exit;                                                                                                     \
                }                                                                                                                  \
                found_bits |= (uint64_t)1 << tp_index;                                                                             \
                {block} tp_index = -1;                                                                                             \
            } else {                                                                                                               \
                ++tp_index;                                                                                                        \
            }                                                                                                                      \
        }                                                                                                                          \
    } while (0)
#define DECODE_CID_TP(_id, dest)                                                                                                   \
    DECODE_TP(_id, {                                                                                                               \
        size_t cidl = end - src;                                                                                                   \
        if (cidl > QUICLY_MAX_CID_LEN_V1) {                                                                                        \
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                                      \
            goto Exit;                                                                                                             \
        }                                                                                                                          \
        if (dest == NULL) {                                                                                                        \
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                                      \
            goto Exit;                                                                                                             \
        } else if (dest != &tp_cid_ignore) {                                                                                       \
            quicly_set_cid(dest, ptls_iovec_init(src, cidl));                                                                      \
        }                                                                                                                          \
        src = end;                                                                                                                 \
    });

    uint64_t found_bits = 0;
    int ret;

    /* set parameters to their default values */
    *params = default_transport_params;

    /* Set optional parameters to UINT8_MAX. It is used to as a sentinel for detecting missing TPs. */
    if (original_dcid != NULL && original_dcid != &tp_cid_ignore)
        original_dcid->len = UINT8_MAX;
    if (initial_scid != NULL && initial_scid != &tp_cid_ignore)
        initial_scid->len = UINT8_MAX;
    if (retry_scid != NULL && retry_scid != &tp_cid_ignore)
        retry_scid->len = UINT8_MAX;

    /* decode the parameters block */
    while (src != end) {
        uint64_t id;
        if ((id = quicly_decodev(&src, end)) == UINT64_MAX) {
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
            goto Exit;
        }
        int tp_index = 0;
        ptls_decode_open_block(src, end, -1, {
            DECODE_CID_TP(QUICLY_TRANSPORT_PARAMETER_ID_ORIGINAL_CONNECTION_ID, original_dcid);
            DECODE_CID_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_SOURCE_CONNECTION_ID, initial_scid);
            DECODE_CID_TP(QUICLY_TRANSPORT_PARAMETER_ID_RETRY_SOURCE_CONNECTION_ID, retry_scid);
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_UDP_PAYLOAD_SIZE, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v < 1200) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v > UINT16_MAX)
                    v = UINT16_MAX;
                params->max_udp_payload_size = (uint16_t)v;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_LOCAL, {
                if ((params->max_stream_data.bidi_local = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_REMOTE, {
                if ((params->max_stream_data.bidi_remote = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_UNI, {
                if ((params->max_stream_data.uni = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_DATA, {
                if ((params->max_data = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_STATELESS_RESET_TOKEN, {
                if (!(stateless_reset_token != NULL && end - src == QUICLY_STATELESS_RESET_TOKEN_LEN)) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                memcpy(stateless_reset_token, src, QUICLY_STATELESS_RESET_TOKEN_LEN);
                src = end;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_IDLE_TIMEOUT, {
                if ((params->max_idle_timeout = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_BIDI, {
                if ((params->max_streams_bidi = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_UNI, {
                if ((params->max_streams_uni = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_ACK_DELAY_EXPONENT, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v > 20) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                params->ack_delay_exponent = (uint8_t)v;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_ACK_DELAY, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v >= 16384) { /* "values of 2^14 or greater are invalid" */
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                params->max_ack_delay = (uint16_t)v;
            });
            /* min_ack_delay is recognized only if the support is enabled on this endpoint */
            if (recognize_delayed_ack) {
                DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MIN_ACK_DELAY, {
                    if ((params->min_ack_delay_usec = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                        goto Exit;
                    }
                    if (params->min_ack_delay_usec >= 16777216) { /* "values of 2^24 or greater are invalid" */
                        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                        goto Exit;
                    }
                });
            }
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_ACTIVE_CONNECTION_ID_LIMIT, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v < QUICLY_MIN_ACTIVE_CONNECTION_ID_LIMIT) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                params->active_connection_id_limit = v;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_DISABLE_ACTIVE_MIGRATION, { params->disable_active_migration = 1; });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_DATAGRAM_FRAME_SIZE, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v > UINT16_MAX)
                    v = UINT16_MAX;
                params->max_datagram_frame_size = (uint16_t)v;
            });
            /* skip unknown extension */
            if (tp_index >= 0)
                src = end;
        });
    }

    /* check consistency between the transpart parameters */
    if (params->min_ack_delay_usec != UINT64_MAX) {
        if (params->min_ack_delay_usec > params->max_ack_delay * 1000) {
            ret = QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
            goto Exit;
        }
    }

    /* check the absence of CIDs */
    if ((original_dcid != NULL && original_dcid->len == UINT8_MAX) || (initial_scid != NULL && initial_scid->len == UINT8_MAX) ||
        (retry_scid != NULL && retry_scid->len == UINT8_MAX)) {
        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
        goto Exit;
    }

    ret = 0;
Exit:
    if (ret == PTLS_ALERT_DECODE_ERROR)
        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
    return ret;

#undef DECODE_TP
#undef DECODE_CID_TP
}